

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlBufferFree(xmlBufferPtr buf)

{
  xmlChar *pxVar1;
  
  if (buf != (xmlBufferPtr)0x0) {
    if (((buf->alloc == XML_BUFFER_ALLOC_IO) && (pxVar1 = buf->contentIO, pxVar1 != (xmlChar *)0x0))
       || (pxVar1 = buf->content,
          buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE && pxVar1 != (xmlChar *)0x0)) {
      (*xmlFree)(pxVar1);
    }
    (*xmlFree)(buf);
    return;
  }
  return;
}

Assistant:

void
xmlBufferFree(xmlBufferPtr buf) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufferFree: buf == NULL\n");
#endif
	return;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->contentIO != NULL)) {
        xmlFree(buf->contentIO);
    } else if ((buf->content != NULL) &&
        (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
        xmlFree(buf->content);
    }
    xmlFree(buf);
}